

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O0

ares_bool_t ares_uri_chis_fragment(char x)

{
  undefined4 local_c;
  char x_local;
  
  if (x == '/') {
    local_c = ARES_TRUE;
  }
  else if (x == '?') {
    local_c = ARES_TRUE;
  }
  else {
    local_c = ares_uri_chis_path(x);
  }
  return local_c;
}

Assistant:

static ares_bool_t ares_uri_chis_fragment(char x)
{
  switch (x) {
    case '/':
      return ARES_TRUE;
    case '?':
      return ARES_TRUE;
    default:
      break;
  }
  return ares_uri_chis_path(x);
}